

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O0

void __thiscall TxIn_EstimateTxInVsize_Test::TestBody(TxIn_EstimateTxInVsize_Test *this)

{
  AddressType AVar1;
  Script SVar2;
  initializer_list<TestEstimateTxInSizeVector> __l;
  bool bVar3;
  int iVar4;
  char *in_stack_fffffffffffffcd8;
  AssertionResult *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  undefined1 in_stack_fffffffffffffcf0 [32];
  TestEstimateTxInSizeVector *local_2c8;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar;
  Message local_280 [2];
  Script local_270;
  uint local_234;
  reference pTStack_230;
  uint32_t vsize;
  TestEstimateTxInSizeVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_> *__range1;
  string local_208 [48];
  TestEstimateTxInSizeVector *local_1d8;
  TestEstimateTxInSizeVector local_1d0;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  Script local_178;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  Script local_130;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  Script local_e8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  Script local_a0;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  Script local_58;
  iterator local_20;
  size_type local_18;
  TxIn_EstimateTxInVsize_Test *local_10;
  TxIn_EstimateTxInVsize_Test *this_local;
  
  local_10 = this;
  if ((TestBody()::test_vector == '\0') &&
     (iVar4 = __cxa_guard_acquire(&TestBody()::test_vector), iVar4 != 0)) {
    __range1._6_1_ = 1;
    local_1d8 = &local_1d0;
    local_1d0.addr_type = kP2pkhAddress;
    local_1d0.size = 0x96;
    local_1d0.witness_size = 0;
    cfd::core::Script::Script(&local_1d0.redeem_script);
    local_1d8 = (TestEstimateTxInSizeVector *)&local_188;
    local_188 = 1;
    local_184 = 0xd0;
    local_180 = 0;
    cfd::core::Script::Script(&local_178,&exp_script);
    local_1d8 = (TestEstimateTxInSizeVector *)&local_140;
    local_140 = 6;
    local_13c = 0x5c;
    local_138 = 0;
    cfd::core::Script::Script(&local_130);
    local_1d8 = (TestEstimateTxInSizeVector *)&local_f8;
    local_f8 = 5;
    local_f4 = 0x70;
    local_f0 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"51",(allocator *)((long)&__range1 + 7));
    cfd::core::Script::Script(&local_e8,local_208);
    local_1d8 = (TestEstimateTxInSizeVector *)&local_b0;
    local_b0 = 4;
    local_ac = 0x45;
    local_a8 = 0;
    cfd::core::Script::Script(&local_a0);
    local_1d8 = (TestEstimateTxInSizeVector *)&local_68;
    local_68 = 3;
    local_64 = 0x53;
    local_60 = 0;
    cfd::core::Script::Script(&local_58,&exp_script);
    __range1._6_1_ = 0;
    local_20 = &local_1d0;
    local_18 = 6;
    std::allocator<TestEstimateTxInSizeVector>::allocator
              ((allocator<TestEstimateTxInSizeVector> *)((long)&__range1 + 5));
    __l._M_len = local_18;
    __l._M_array = local_20;
    std::vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>::vector
              (&TestBody::test_vector,__l,
               (allocator<TestEstimateTxInSizeVector> *)((long)&__range1 + 5));
    std::allocator<TestEstimateTxInSizeVector>::~allocator
              ((allocator<TestEstimateTxInSizeVector> *)((long)&__range1 + 5));
    local_2c8 = (TestEstimateTxInSizeVector *)&local_20;
    do {
      local_2c8 = local_2c8 + -1;
      TestEstimateTxInSizeVector::~TestEstimateTxInSizeVector(local_2c8);
    } while (local_2c8 != &local_1d0);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    __cxa_atexit(std::
                 vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>::
                 ~vector,&TestBody::test_vector,&__dso_handle);
    __cxa_guard_release(&TestBody()::test_vector);
  }
  __end1 = std::vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>::
           begin(&TestBody::test_vector);
  test_data = (TestEstimateTxInSizeVector *)
              std::vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>::
              end(&TestBody::test_vector);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_TestEstimateTxInSizeVector_*,_std::vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>_>
                                     *)&test_data), bVar3) {
    pTStack_230 = __gnu_cxx::
                  __normal_iterator<const_TestEstimateTxInSizeVector_*,_std::vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>_>
                  ::operator*(&__end1);
    local_234 = 0;
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        AVar1 = pTStack_230->addr_type;
        cfd::core::Script::Script(&local_270,&pTStack_230->redeem_script);
        SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = &in_stack_fffffffffffffce0->success_;
        SVar2._vptr_Script = (_func_int **)in_stack_fffffffffffffcd8;
        SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffce8;
        SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffffcef;
        SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffcf0._0_8_
        ;
        SVar2.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data =
             (_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
             (_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
             in_stack_fffffffffffffcf0._8_24_;
        local_234 = cfd::core::TxIn::EstimateTxInVsize(AVar1,SVar2,&local_270);
        cfd::core::Script::~Script(&local_270);
      }
    }
    else {
      testing::Message::Message(local_280);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txin_txinreference.cpp"
                 ,0x52,
                 "Expected: (vsize = TxIn::EstimateTxInVsize( test_data.addr_type, test_data.redeem_script)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_280);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_280);
    }
    in_stack_fffffffffffffce0 = (AssertionResult *)local_298;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)in_stack_fffffffffffffce0,"vsize","test_data.size",&local_234,
               &pTStack_230->size);
    in_stack_fffffffffffffcef =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffce0);
    if (!(bool)in_stack_fffffffffffffcef) {
      testing::Message::Message(&local_2a0);
      in_stack_fffffffffffffcd8 =
           testing::AssertionResult::failure_message((AssertionResult *)local_298);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txin_txinreference.cpp"
                 ,0x53,in_stack_fffffffffffffcd8);
      testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
      testing::internal::AssertHelper::~AssertHelper(&local_2a8);
      testing::Message::~Message(&local_2a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
    __gnu_cxx::
    __normal_iterator<const_TestEstimateTxInSizeVector_*,_std::vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

TEST(TxIn, EstimateTxInVsize) {
  static const std::vector<TestEstimateTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script()},
    {AddressType::kP2shAddress, 208, 0, exp_script},
    {AddressType::kP2shP2wpkhAddress, 92, 0, Script()},
    {AddressType::kP2shP2wshAddress, 112, 0, Script("51")},
    {AddressType::kP2wpkhAddress, 69, 0, Script()},
    {AddressType::kP2wshAddress, 83, 0, exp_script},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    EXPECT_NO_THROW((vsize = TxIn::EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script)));
    EXPECT_EQ(vsize, test_data.size);
  }
}